

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O1

_Bool borg_recharging(void)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  borg_item_conflict *pbVar4;
  _Bool _Var5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (z_info->pack_size != 0)) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pbVar4 = borg_items;
      iVar7 = 4;
      if (((borg_items->curses[lVar8 + -0x26] != false) &&
          (borg_items->curses[lVar8 + -0x2e] == true)) &&
         ((borg_items->curses[lVar8 + -0x2c] == true &&
          ((*(char **)(borg_items->curses + lVar8 + -0x3a) == (char *)0x0 ||
           (pcVar6 = strstr(*(char **)(borg_items->curses + lVar8 + -0x3a),"empty"),
           pcVar6 == (char *)0x0)))))) {
        if (pbVar4->curses[lVar8 + -0x2a] == true) {
          bVar2 = *(short *)(pbVar4->curses + lVar8 + -0x28) < 2;
        }
        else {
          bVar2 = false;
        }
        if (pbVar4->curses[lVar8 + -0x2a] == true) {
          bVar3 = bVar2;
          if (((*(short *)(pbVar4->curses + lVar8 + -0x28) < 2) &&
              (_Var5 = borg_spell_okay_fail(RECHARGING,L'`'), _Var5)) &&
             ((int)(uint)pbVar4->curses[lVar8 + -0x29] < sv_staff_power)) {
            bVar3 = true;
          }
          sVar1 = *(short *)(pbVar4->curses + lVar8 + -0x28);
          if (sVar1 < 2) {
            bVar3 = true;
          }
          if (((sv_staff_teleportation == (uint)pbVar4->curses[lVar8 + -0x29]) && (sVar1 < 3)) &&
             (borg.trait[0x69] == 0)) {
            bVar3 = true;
          }
          bVar2 = bVar3;
          if (3 < (int)((uint)pbVar4->curses[lVar8 + -0x26] + (int)sVar1)) {
            bVar2 = false;
          }
          if (sVar1 < 1) {
            bVar2 = bVar3;
          }
        }
        if (bVar2) {
          _Var5 = borg_read_scroll(sv_scroll_recharging);
          if ((!_Var5) && (_Var5 = borg_spell_fail(RECHARGING,L'`'), !_Var5)) {
            _Var5 = borg_activate_item(act_recharge);
            iVar7 = 2;
            if (!_Var5) goto LAB_0022d4ca;
          }
          pcVar6 = format("Recharging %s with current charge of %d",pbVar4->desc + lVar8,
                          (ulong)(uint)(int)*(short *)(pbVar4->curses + lVar8 + -0x28));
          borg_note(pcVar6);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar9]);
          iVar7 = 1;
          if ((*(char **)(pbVar4->curses + lVar8 + -0x3a) != (char *)0x0) &&
             (pcVar6 = strstr(*(char **)(pbVar4->curses + lVar8 + -0x3a),"empty"),
             pcVar6 != (char *)0x0)) {
            borg_deinscribe((int)uVar9);
          }
        }
      }
LAB_0022d4ca:
      if (iVar7 != 4) {
        if (iVar7 == 2) {
          return false;
        }
        return true;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x388;
    } while (uVar9 < z_info->pack_size);
  }
  return false;
}

Assistant:

bool borg_recharging(void)
{
    int  i      = -1;
    bool charge = false;

    /* Forbid blind/confused */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED])
        return false;

    /* XXX XXX XXX Dark */

    /* Look for an item to recharge */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident || !item->aware)
            continue;

        if (item->note && strstr(item->note, "empty"))
            continue;

        /* assume we can't charge it. */
        charge = false;

        /* Wands with no charges can be charged */
        if ((item->tval == TV_WAND) && (item->pval <= 1))
            charge = true;

        /* recharge staves sometimes */
        if (item->tval == TV_STAFF) {
            /* Allow staves to be recharged at 2 charges if
             * the borg has the big recharge spell. And its not a *Dest*
             */
            if ((item->pval < 2) && (borg_spell_okay_fail(RECHARGING, 96))
                && item->sval < sv_staff_power)
                charge = true;

            /* recharge any staff at 0 charges */
            if (item->pval <= 1)
                charge = true;

            /* Staves of teleport get recharged at 2 charges in town */
            if ((item->sval == sv_staff_teleportation) && (item->pval < 3)
                && !borg.trait[BI_CDEPTH])
                charge = true;

            /* They stack.  If quantity is 4 and pval is 1, then there are 4
             * charges. */
            if ((item->iqty + item->pval >= 4) && item->pval >= 1)
                charge = false;
        }

        /* get the next item if we are not to charge this one */
        if (!charge)
            continue;

        /* Attempt to recharge */
        if (borg_read_scroll(sv_scroll_recharging)
            || borg_spell_fail(RECHARGING, 96)
            || borg_activate_item(act_recharge)) {
            /* Message */
            borg_note(format("Recharging %s with current charge of %d",
                item->desc, item->pval));

            /* Recharge the item */
            borg_keypress(all_letters_nohjkl[i]);

            /* Remove the {empty} if present */
            if (item->note && strstr(item->note, "empty"))
                borg_deinscribe(i);

            /* Success */
            return true;
        } else
            /* if we fail once, no need to try again. */
            break;
    }

    /* Nope */
    return false;
}